

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_info.h
# Opt level: O1

bool __thiscall
KokkosTools::KernelTimer::KernelPerformanceInfo::readFromFile
          (KernelPerformanceInfo *this,FILE *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  KernelExecutionType KVar3;
  size_t sVar4;
  uint *__ptr;
  ulong __size;
  string_view mangled_name;
  uint32_t recordLen;
  uint local_54;
  string local_50;
  
  local_54 = 0;
  sVar4 = fread(&local_54,4,1,(FILE *)input);
  if ((sVar4 & 0xffffffff) == 1) {
    __size = (ulong)local_54;
    __ptr = (uint *)malloc(__size);
    fread(__ptr,__size,1,(FILE *)input);
    uVar2 = *__ptr;
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,__ptr + 1,(long)__ptr + (ulong)uVar2 + 4);
    std::__cxx11::string::operator=((string *)this,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    mangled_name._M_str = (char *)input;
    mangled_name._M_len = (size_t)(this->kernelName)._M_dataplus._M_p;
    demangleNameKokkos_abi_cxx11_
              (&local_50,(KokkosTools *)(this->kernelName)._M_string_length,mangled_name);
    std::__cxx11::string::operator=((string *)this,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    this->callCount = *(uint64_t *)((long)__ptr + (ulong)(uVar2 + 4));
    this->time = *(double *)((long)__ptr + (ulong)(uVar2 + 0xc));
    this->timeSq = *(double *)((long)__ptr + (ulong)(uVar2 + 0x14));
    KVar3 = *(KernelExecutionType *)((long)__ptr + (ulong)(uVar2 + 0x1c));
    if (KVar3 < 4) {
      this->kType = KVar3;
    }
    free(__ptr);
  }
  return (int)sVar4 == 1;
}

Assistant:

bool readFromFile(FILE* input) {
    uint32_t recordLen   = 0;
    uint32_t actual_read = fread(&recordLen, sizeof(recordLen), 1, input);
    if (actual_read != 1) return false;

    char* entry = (char*)malloc(recordLen);
    fread(entry, recordLen, 1, input);

    uint32_t nextIndex = 0;
    uint32_t kernelNameLength;
    copy((char*)&kernelNameLength, &entry[nextIndex], sizeof(kernelNameLength));
    nextIndex += sizeof(kernelNameLength);

    this->kernelName = std::string(&entry[nextIndex], kernelNameLength);

    kernelName = demangleNameKokkos(kernelName);

    nextIndex += kernelNameLength;

    copy((char*)&callCount, &entry[nextIndex], sizeof(callCount));
    nextIndex += sizeof(callCount);

    copy((char*)&time, &entry[nextIndex], sizeof(time));
    nextIndex += sizeof(time);

    copy((char*)&timeSq, &entry[nextIndex], sizeof(timeSq));
    nextIndex += sizeof(timeSq);

    uint32_t kernelT = 0;
    copy((char*)&kernelT, &entry[nextIndex], sizeof(kernelT));
    nextIndex += sizeof(kernelT);

    if (kernelT == 0) {
      kType = PARALLEL_FOR;
    } else if (kernelT == 1) {
      kType = PARALLEL_REDUCE;
    } else if (kernelT == 2) {
      kType = PARALLEL_SCAN;
    } else if (kernelT == 3) {
      kType = REGION;
    }

    free(entry);
    return true;
  }